

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *facset,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *resvecprev,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *tmpvec,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *qcurr,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char cVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  uint local_108 [3];
  bool local_fc;
  undefined8 local_f8;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_108._0_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 8);
  auVar2 = *(undefined1 (*) [16])(eprev->m_backend).data._M_elems;
  local_118._0_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 4);
  uVar1 = *(undefined8 *)((eprev->m_backend).data._M_elems + 6);
  stack0xfffffffffffffef0 = (undefined5)uVar1;
  uStack_10b = (undefined3)((ulong)uVar1 >> 0x28);
  iVar3 = (eprev->m_backend).exp;
  cVar4 = (eprev->m_backend).neg;
  fVar5 = (eprev->m_backend).fpclass;
  iVar6 = (eprev->m_backend).prec_elem;
  local_f8._0_4_ = (eprev->m_backend).fpclass;
  local_f8._4_4_ = (eprev->m_backend).prec_elem;
  local_e8.data._M_elems._32_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 8);
  local_e8.data._M_elems._0_8_ = *(undefined8 *)(epsilon->m_backend).data._M_elems;
  local_e8.data._M_elems._8_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 2);
  local_e8.data._M_elems._16_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 4);
  local_e8.data._M_elems._24_8_ = *(undefined8 *)((epsilon->m_backend).data._M_elems + 6);
  local_e8.exp = (epsilon->m_backend).exp;
  local_e8.neg = (epsilon->m_backend).neg;
  local_e8.fpclass = (epsilon->m_backend).fpclass;
  local_e8.prec_elem = (epsilon->m_backend).prec_elem;
  local_fc = (bool)cVar4;
  if (((bool)cVar4 == true) &&
     (local_128._0_4_ = (undefined4)*(undefined8 *)(eprev->m_backend).data._M_elems,
     local_128._0_4_ != 0 || fVar5 != cpp_dec_float_finite)) {
    local_fc = false;
  }
  local_128 = auVar2;
  local_108[2] = iVar3;
  if (local_e8.fpclass == cpp_dec_float_NaN || fVar5 == cpp_dec_float_NaN) {
LAB_00134cf5:
    local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eprev->m_backend).data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eprev->m_backend).data._M_elems + 6);
    local_68.m_backend.exp = iVar3;
    local_68.m_backend.neg = (bool)cVar4;
    local_68.m_backend.fpclass = fVar5;
    local_68.m_backend.prec_elem = iVar6;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)resvec,&local_68);
  }
  else {
    iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      ((cpp_dec_float<50U,_int,_void> *)local_128,&local_e8);
    if (0 < iVar3) {
      iVar3 = (eprev->m_backend).exp;
      cVar4 = (eprev->m_backend).neg;
      fVar5 = (eprev->m_backend).fpclass;
      iVar6 = (eprev->m_backend).prec_elem;
      goto LAB_00134cf5;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(resvec);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(tmpvec);
  iVar3 = (resvecprev->super_IdxSet).num;
  if (iVar3 == 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  else {
    if ((tmpvec->setupStatus != true) ||
       ((double)(facset->set).thenum *
        (double)((int)((ulong)((long)(tmpvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(tmpvec->
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
        * 0.5 < (double)(facset->
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ).thesize * (double)iVar3)) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2productFull<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)tmpvec,facset,resvecprev);
      tmpvec->setupStatus = false;
      goto LAB_00134db3;
    }
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)tmpvec,facset,resvecprev);
  }
  tmpvec->setupStatus = true;
LAB_00134db3:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(tmpvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,tmpvec);
  local_78._0_4_ = cpp_dec_float_finite;
  local_78._4_4_ = 10;
  local_a8 = (undefined1  [16])0x0;
  local_98 = SUB1613((undefined1  [16])0x0,0);
  uStack_8b = 0;
  auStack_88 = SUB1613((undefined1  [16])0x0,3);
  local_f8._0_4_ = cpp_dec_float_finite;
  local_f8._4_4_ = 10;
  local_128 = (undefined1  [16])0x0;
  local_118[0] = 0;
  local_118[1] = 0;
  stack0xfffffffffffffef0 = 0;
  uStack_10b = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_128,-1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_a8,(cpp_dec_float<50U,_int,_void> *)local_128,
             &qcurr->m_backend);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)resvec,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(resvec);
  return;
}

Assistant:

static inline void updateRes(
   const SVSetBase<R> facset,
   const SSVectorBase<R> resvecprev,
   SSVectorBase<R>& resvec,
   SSVectorBase<R>& tmpvec,
   R eprev,
   R qcurr,
   R epsilon)
{
   assert(qcurr != 0.0);

   if(isZero(eprev, epsilon))
      resvec.clear();
   else
      resvec *= eprev;

   int dummy1 = 0;
   int dummy2 = 0;
   tmpvec.assign2product4setup(facset, resvecprev, nullptr, nullptr, dummy1, dummy2);
   tmpvec.setup();
   resvec += tmpvec;

   resvec *= (-1.0 / qcurr);
   resvec.setup();
}